

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O0

XML_Convert_Result
utf8_toUtf16(ENCODING *enc,char **fromP,char *fromLim,unsigned_short **toP,unsigned_short *toLim)

{
  char cVar1;
  ulong uVar2;
  unsigned_long n;
  char *from;
  unsigned_short *to;
  XML_Convert_Result res;
  unsigned_short *toLim_local;
  unsigned_short **toP_local;
  char *fromLim_local;
  char **fromP_local;
  ENCODING *enc_local;
  
  to._4_4_ = XML_CONVERT_COMPLETED;
  n = (unsigned_long)*fromP;
  from = (char *)*toP;
LAB_006de3f5:
  do {
    if (fromLim <= n || toLim <= from) {
      if (n < fromLim) {
        to._4_4_ = XML_CONVERT_OUTPUT_EXHAUSTED;
      }
LAB_006de637:
      *fromP = (char *)n;
      *toP = (unsigned_short *)from;
      return to._4_4_;
    }
    cVar1 = *(char *)((long)enc[1].scanners + (ulong)*(byte *)n);
    if (cVar1 != '\x05') {
      if (cVar1 == '\x06') {
        if ((long)((long)fromLim - n) < 3) {
          to._4_4_ = XML_CONVERT_INPUT_INCOMPLETE;
          goto LAB_006de637;
        }
        *(ushort *)from =
             (short)*(char *)n << 0xc | ((short)*(char *)(n + 1) & 0x3fU) << 6 |
             (short)*(char *)(n + 2) & 0x3fU;
        n = n + 3;
        from = from + 2;
      }
      else if (cVar1 == '\a') {
        if ((long)toLim - (long)from >> 1 < 2) {
          to._4_4_ = XML_CONVERT_OUTPUT_EXHAUSTED;
          goto LAB_006de637;
        }
        if ((long)((long)fromLim - n) < 4) {
          to._4_4_ = XML_CONVERT_INPUT_INCOMPLETE;
          goto LAB_006de637;
        }
        uVar2 = (long)(int)(((int)*(char *)n & 7U) << 0x12 | ((int)*(char *)(n + 1) & 0x3fU) << 0xc
                            | ((int)*(char *)(n + 2) & 0x3fU) << 6 | (int)*(char *)(n + 3) & 0x3fU)
                - 0x10000;
        *(ushort *)from = (ushort)(uVar2 >> 10) | 0xd800;
        *(ushort *)(from + 2) = (ushort)uVar2 & 0x3ff | 0xdc00;
        n = n + 4;
        from = from + 4;
      }
      else {
        *(short *)from = (short)*(char *)n;
        n = n + 1;
        from = from + 2;
      }
      goto LAB_006de3f5;
    }
    if ((long)((long)fromLim - n) < 2) {
      to._4_4_ = XML_CONVERT_INPUT_INCOMPLETE;
      goto LAB_006de637;
    }
    *(ushort *)from = ((short)*(char *)n & 0x1fU) << 6 | (short)*(char *)(n + 1) & 0x3fU;
    n = n + 2;
    from = from + 2;
  } while( true );
}

Assistant:

static enum XML_Convert_Result PTRCALL
utf8_toUtf16(const ENCODING *enc,
             const char **fromP, const char *fromLim,
             unsigned short **toP, const unsigned short *toLim)
{
  enum XML_Convert_Result res = XML_CONVERT_COMPLETED;
  unsigned short *to = *toP;
  const char *from = *fromP;
  while (from < fromLim && to < toLim) {
    switch (((struct normal_encoding *)enc)->type[(unsigned char)*from]) {
    case BT_LEAD2:
      if (fromLim - from < 2) {
        res = XML_CONVERT_INPUT_INCOMPLETE;
        goto after;
      }
      *to++ = (unsigned short)(((from[0] & 0x1f) << 6) | (from[1] & 0x3f));
      from += 2;
      break;
    case BT_LEAD3:
      if (fromLim - from < 3) {
        res = XML_CONVERT_INPUT_INCOMPLETE;
        goto after;
      }
      *to++ = (unsigned short)(((from[0] & 0xf) << 12)
                               | ((from[1] & 0x3f) << 6) | (from[2] & 0x3f));
      from += 3;
      break;
    case BT_LEAD4:
      {
        unsigned long n;
        if (toLim - to < 2) {
          res = XML_CONVERT_OUTPUT_EXHAUSTED;
          goto after;
        }
        if (fromLim - from < 4) {
          res = XML_CONVERT_INPUT_INCOMPLETE;
          goto after;
        }
        n = ((from[0] & 0x7) << 18) | ((from[1] & 0x3f) << 12)
            | ((from[2] & 0x3f) << 6) | (from[3] & 0x3f);
        n -= 0x10000;
        to[0] = (unsigned short)((n >> 10) | 0xD800);
        to[1] = (unsigned short)((n & 0x3FF) | 0xDC00);
        to += 2;
        from += 4;
      }
      break;
    default:
      *to++ = *from++;
      break;
    }
  }
  if (from < fromLim)
    res = XML_CONVERT_OUTPUT_EXHAUSTED;
after:
  *fromP = from;
  *toP = to;
  return res;
}